

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

int lws_http_get_uri_and_method(lws *wsi,char **puri_ptr,int *puri_len)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  
  iVar3 = 0;
  for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
    iVar2 = lws_hdr_total_length(wsi,(uint)""[lVar5]);
    iVar3 = (iVar3 + 1) - (uint)(iVar2 == 0);
  }
  if (iVar3 == 1) {
LAB_00134bb6:
    for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
      bVar1 = ""[lVar5];
      iVar3 = lws_hdr_total_length(wsi,(uint)bVar1);
      if (iVar3 != 0) {
        pcVar4 = lws_hdr_simple_ptr(wsi,(uint)bVar1);
        *puri_ptr = pcVar4;
        iVar3 = lws_hdr_total_length(wsi,(uint)bVar1);
        *puri_len = iVar3;
        return (int)lVar5;
      }
    }
  }
  else {
    if (iVar3 == 0) {
      pcVar4 = "Missing URI in HTTP request\n";
    }
    else {
      if (((wsi->field_0x2dc & 0x12) != 0) &&
         (iVar3 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_COLON_PATH), iVar3 != 0))
      goto LAB_00134bb6;
      pcVar4 = "multiple methods?\n";
    }
    _lws_log(2,pcVar4);
  }
  return -1;
}

Assistant:

int
lws_http_get_uri_and_method(struct lws *wsi, char **puri_ptr, int *puri_len)
{
	int n, count = 0;

	for (n = 0; n < (int)LWS_ARRAY_SIZE(methods); n++)
		if (lws_hdr_total_length(wsi, methods[n]))
			count++;
	if (!count) {
		lwsl_warn("Missing URI in HTTP request\n");
		return -1;
	}

	if (count != 1 &&
	    !((wsi->mux_substream || wsi->h2_stream_carries_ws) &&
	      lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COLON_PATH))) {
		lwsl_warn("multiple methods?\n");
		return -1;
	}

	for (n = 0; n < (int)LWS_ARRAY_SIZE(methods); n++)
		if (lws_hdr_total_length(wsi, methods[n])) {
			*puri_ptr = lws_hdr_simple_ptr(wsi, methods[n]);
			*puri_len = lws_hdr_total_length(wsi, methods[n]);
			return n;
		}

	return -1;
}